

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitStringConcat
          (WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  Expression *pEVar1;
  Expression *pEVar2;
  StringConcat *this_00;
  
  if (code == 0x88) {
    pEVar1 = popNonVoidExpression(this);
    pEVar2 = popNonVoidExpression(this);
    this_00 = (StringConcat *)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)77>).super_Expression._id =
         StringConcatId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)77>).super_Expression.type.id = 0;
    this_00->left = pEVar2;
    this_00->right = pEVar1;
    StringConcat::finalize(this_00);
    *out = (Expression *)this_00;
  }
  return code == 0x88;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitStringConcat(Expression*& out,
                                               uint32_t code) {
  if (code != BinaryConsts::StringConcat) {
    return false;
  }
  auto* right = popNonVoidExpression();
  auto* left = popNonVoidExpression();
  out = Builder(wasm).makeStringConcat(left, right);
  return true;
}